

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

string * __thiscall
soul::SourceCodeUtilities::getFileSummaryTitle_abi_cxx11_
          (string *__return_storage_ptr__,SourceCodeUtilities *this,Comment *summary)

{
  bool bVar1;
  string_view t;
  string_view t_00;
  string_view s;
  string_view s_00;
  string local_c0;
  string firstLine;
  string local_80;
  string local_60;
  string local_40;
  
  if ((*this == (SourceCodeUtilities)0x1) && (*(string **)(this + 8) != *(string **)(this + 0x10)))
  {
    std::__cxx11::string::string((string *)&local_40,*(string **)(this + 8));
    choc::text::trim(&firstLine,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string((string *)&local_60,(string *)&firstLine);
    toLowerCase(&local_c0,&local_60);
    t._M_str = local_c0._M_dataplus._M_p;
    t._M_len = local_c0._M_string_length;
    s._M_str = "title:";
    s._M_len = 6;
    bVar1 = choc::text::startsWith(t,s);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&local_80,(ulong)&firstLine);
      choc::text::trim(__return_storage_ptr__,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      t_00._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
      t_00._M_len = __return_storage_ptr__->_M_string_length;
      s_00._M_str = ".";
      s_00._M_len = 1;
      bVar1 = choc::text::endsWith(t_00,s_00);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&local_c0,(ulong)__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      std::__cxx11::string::~string((string *)&firstLine);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)&firstLine);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeUtilities::getFileSummaryTitle (const Comment& summary)
{
    if (summary.valid && ! summary.lines.empty())
    {
        auto firstLine = choc::text::trim (summary.lines[0]);

        if (choc::text::startsWith (toLowerCase (firstLine), "title:"))
        {
            auto title = choc::text::trim (firstLine.substr (6));

            if (choc::text::endsWith (title, "."))
                title = title.substr (title.length() - 1);

            return title;
        }
    }

    return {};
}